

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

void mcpl_recalc_psize(mcpl_outfile_t of)

{
  double dVar1;
  int iVar2;
  mcpl_outfileinternal_t *f;
  undefined4 uVar3;
  
  iVar2 = *(int *)((long)of.internal + 0x50);
  uVar3 = 0x1c;
  if (iVar2 == 0) {
    uVar3 = 0x38;
  }
  *(undefined4 *)((long)of.internal + 0x70) = uVar3;
  if (*(int *)((long)of.internal + 0x4c) != 0) {
    uVar3 = 0x28;
    if (iVar2 == 0) {
      uVar3 = 0x50;
    }
    *(undefined4 *)((long)of.internal + 0x70) = uVar3;
  }
  if (*(int *)((long)of.internal + 0x54) == 0) {
    *(int *)((long)of.internal + 0x70) = *(int *)((long)of.internal + 0x70) + 4;
  }
  dVar1 = *(double *)((long)of.internal + 0x58);
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    *(int *)((long)of.internal + 0x70) =
         *(int *)((long)of.internal + 0x70) + (uint)(iVar2 == 0) * 4 + 4;
  }
  if (*(int *)((long)of.internal + 0x48) != 0) {
    *(int *)((long)of.internal + 0x70) = *(int *)((long)of.internal + 0x70) + 4;
  }
  if (*(uint *)((long)of.internal + 0x70) < 0x61) {
    *(uint *)((long)of.internal + 0x80) =
         *(int *)((long)of.internal + 0x48) * 0x10 +
         iVar2 + *(int *)((long)of.internal + 0x4c) * 2 +
         (uint)(*(int *)((long)of.internal + 0x54) != 0) * 4 + (-(uint)(dVar1 != 0.0) & 1) * 8;
    return;
  }
  (*mcpl_error_handler)("unexpected particle size");
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

MCPL_LOCAL void mcpl_recalc_psize(mcpl_outfile_t of)
{
  MCPLIMP_OUTFILEDECODE;
  unsigned fp = f->opt_singleprec ? sizeof(float) : sizeof(double);
  f->particle_size = 7*fp;
  if (f->opt_polarisation)
    f->particle_size += 3*fp;
  if (!f->opt_universalpdgcode)
    f->particle_size += sizeof(int32_t);
  if (!f->opt_universalweight)
    f->particle_size += fp;
  if (f->opt_userflags)
    f->particle_size += sizeof(uint32_t);
  if ( ! (f->particle_size<=MCPLIMP_MAX_PARTICLE_SIZE) )
    mcpl_error("unexpected particle size");
  f->opt_signature = 0
    + 1 * f->opt_singleprec
    + 2 * f->opt_polarisation
    + 4 * (f->opt_universalpdgcode?1:0)
    + 8 * (f->opt_universalweight?1:0)
    + 16 * f->opt_userflags;
}